

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O0

void transencode_master_selection(j_compress_ptr cinfo,jvirt_barray_ptr *coef_arrays)

{
  j_compress_ptr in_RSI;
  jvirt_barray_ptr *in_RDI;
  j_compress_ptr unaff_retaddr;
  boolean in_stack_ffffffffffffffec;
  
  *(undefined4 *)(in_RDI + 7) = 1;
  jinit_c_master_control(in_RSI,in_stack_ffffffffffffffec);
  if (*(int *)((long)in_RDI + 0x104) == 0) {
    if (*(int *)((long)in_RDI + 0x134) == 0) {
      jinit_huff_encoder(in_RSI);
    }
    else {
      jinit_phuff_encoder(in_RSI);
    }
  }
  else {
    jinit_arith_encoder(in_RSI);
  }
  transencode_coef_controller(unaff_retaddr,in_RDI);
  jinit_marker_writer(in_RSI);
  (*(code *)in_RDI[1]->next)(in_RDI);
  (*(code *)in_RDI[0x3a]->mem_buffer)(in_RDI);
  return;
}

Assistant:

LOCAL(void)
transencode_master_selection(j_compress_ptr cinfo,
                             jvirt_barray_ptr *coef_arrays)
{
  /* Although we don't actually use input_components for transcoding,
   * jcmaster.c's initial_setup will complain if input_components is 0.
   */
  cinfo->input_components = 1;
  /* Initialize master control (includes parameter checking/processing) */
  jinit_c_master_control(cinfo, TRUE /* transcode only */);

  /* Entropy encoding: either Huffman or arithmetic coding. */
  if (cinfo->arith_code) {
#ifdef C_ARITH_CODING_SUPPORTED
    jinit_arith_encoder(cinfo);
#else
    ERREXIT(cinfo, JERR_ARITH_NOTIMPL);
#endif
  } else {
    if (cinfo->progressive_mode) {
#ifdef C_PROGRESSIVE_SUPPORTED
      jinit_phuff_encoder(cinfo);
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
    } else
      jinit_huff_encoder(cinfo);
  }

  /* We need a special coefficient buffer controller. */
  transencode_coef_controller(cinfo, coef_arrays);

  jinit_marker_writer(cinfo);

  /* We can now tell the memory manager to allocate virtual arrays. */
  (*cinfo->mem->realize_virt_arrays) ((j_common_ptr)cinfo);

  /* Write the datastream header (SOI, JFIF) immediately.
   * Frame and scan headers are postponed till later.
   * This lets application insert special markers after the SOI.
   */
  (*cinfo->marker->write_file_header) (cinfo);
}